

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O0

vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *
CRange::init_target(vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *__return_storage_ptr__,
                   char *targetfile)

{
  allocator local_39;
  string local_38 [8];
  string targetstring;
  char *targetfile_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,targetfile,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  init_target(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CRange::Tdata> CRange::init_target( const char *targetfile )
{
    const std::string targetstring = targetfile;
    return CRange::init_target(targetstring);
}